

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O1

uint * Gia_ManTerStateCreate(Gia_ManTer_t *p)

{
  long lVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  uint *puVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  uint *puVar7;
  void **ppvVar8;
  int **ppiVar9;
  uint uVar10;
  byte bVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  
  pVVar3 = p->pAig->vCis;
  iVar15 = pVVar3->nSize;
  iVar2 = p->pAig->nRegs;
  iVar14 = iVar15 - iVar2;
  puVar7 = (uint *)calloc((long)p->nStateWords * 4 + 8,1);
  if (iVar14 < pVVar3->nSize) {
    puVar4 = p->pDataSimCis;
    bVar11 = 0;
    lVar12 = 0;
    do {
      iVar6 = (int)lVar12;
      uVar10 = puVar4[iVar14 + iVar6 >> 4] >>
               ((char)iVar15 * '\x02' + (char)iVar2 * -2 + bVar11 & 0x1e);
      uVar13 = uVar10 & 3;
      if (uVar13 == 0) {
        __assert_fail("Value >= GIA_ZER && Value <= GIA_UND",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTsim.c"
                      ,0x24,"void Gia_ManTerSimInfoSet(unsigned int *, int, int)");
      }
      puVar7[iVar6 >> 4] =
           ((puVar7[iVar6 >> 4] >> (bVar11 & 0x1e) ^ uVar10) & 3) << (bVar11 & 0x1e) ^
           puVar7[iVar6 >> 4];
      ppiVar9 = &p->pCount0;
      if ((uVar13 == 1) || (ppiVar9 = &p->pCountX, uVar13 == 3)) {
        (*ppiVar9)[iVar6] = (*ppiVar9)[iVar6] + 1;
      }
      bVar11 = bVar11 + 2;
      lVar1 = iVar14 + lVar12;
      lVar12 = lVar12 + 1;
    } while (lVar1 + 1 < (long)pVVar3->nSize);
  }
  pVVar5 = p->vStates;
  uVar10 = pVVar5->nCap;
  if (pVVar5->nSize == uVar10) {
    if ((int)uVar10 < 0x10) {
      if (pVVar5->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar5->pArray,0x80);
      }
      pVVar5->pArray = ppvVar8;
      iVar15 = 0x10;
    }
    else {
      iVar15 = uVar10 * 2;
      if (iVar15 <= (int)uVar10) goto LAB_0073bf14;
      if (pVVar5->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc((ulong)uVar10 << 4);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar5->pArray,(ulong)uVar10 << 4);
      }
      pVVar5->pArray = ppvVar8;
    }
    pVVar5->nCap = iVar15;
  }
LAB_0073bf14:
  iVar15 = pVVar5->nSize;
  pVVar5->nSize = iVar15 + 1;
  pVVar5->pArray[iVar15] = puVar7;
  return puVar7;
}

Assistant:

unsigned * Gia_ManTerStateCreate( Gia_ManTer_t * p )
{
    int i, Value, nPis = Gia_ManPiNum(p->pAig);
    unsigned * pRes = Gia_ManTerStateAlloc( p->nStateWords );
    for ( i = nPis; i < Gia_ManCiNum(p->pAig); i++ )
    {
        Value = Gia_ManTerSimInfoGet( p->pDataSimCis, i );
        Gia_ManTerSimInfoSet( pRes, i-nPis, Value );
        if ( Value == GIA_ZER )
            p->pCount0[i-nPis]++;
        if ( Value == GIA_UND )
            p->pCountX[i-nPis]++;
    }
    Vec_PtrPush( p->vStates, pRes );
    return pRes;    
}